

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mem.cpp
# Opt level: O3

void __thiscall r_exec::_Mem::_Mem(_Mem *this)

{
  deque<r_exec::_ReductionJob_*,_std::allocator<r_exec::_ReductionJob_*>_> *pdVar1;
  deque<r_exec::TimeJob_*,_std::allocator<r_exec::TimeJob_*>_> *pdVar2;
  ModelBase *this_00;
  
  r_code::Mem::Mem(&this->super_Mem);
  *(undefined ***)this = &PTR___cxa_pure_virtual_001c0770;
  *(undefined1 (*) [16])&(this->m_reductionJobQueue).m_mutex.super___mutex_base._M_mutex =
       (undefined1  [16])0x0;
  *(undefined1 (*) [16])
   ((long)&(this->m_reductionJobQueue).m_mutex.super___mutex_base._M_mutex + 0x10) =
       (undefined1  [16])0x0;
  *(undefined1 (*) [16])
   &(this->m_reductionJobQueue).m_mutex.super___mutex_base._M_mutex.__data.__list.__next =
       (undefined1  [16])0x0;
  pdVar1 = &(this->m_reductionJobQueue).m_jobs.c;
  (pdVar1->super__Deque_base<r_exec::_ReductionJob_*,_std::allocator<r_exec::_ReductionJob_*>_>).
  _M_impl.super__Deque_impl_data._M_map_size = 0;
  (pdVar1->super__Deque_base<r_exec::_ReductionJob_*,_std::allocator<r_exec::_ReductionJob_*>_>).
  _M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  *(undefined1 (*) [16])
   ((long)&(this->m_reductionJobQueue).m_jobs.c.
           super__Deque_base<r_exec::_ReductionJob_*,_std::allocator<r_exec::_ReductionJob_*>_>.
           _M_impl.super__Deque_impl_data._M_start + 8) = (undefined1  [16])0x0;
  *(undefined1 (*) [16])
   ((long)&(this->m_reductionJobQueue).m_jobs.c.
           super__Deque_base<r_exec::_ReductionJob_*,_std::allocator<r_exec::_ReductionJob_*>_>.
           _M_impl.super__Deque_impl_data._M_start + 0x18) = (undefined1  [16])0x0;
  *(undefined1 (*) [16])
   ((long)&(this->m_reductionJobQueue).m_jobs.c.
           super__Deque_base<r_exec::_ReductionJob_*,_std::allocator<r_exec::_ReductionJob_*>_>.
           _M_impl.super__Deque_impl_data._M_finish + 8) = (undefined1  [16])0x0;
  *(_Map_pointer *)
   ((long)&(this->m_reductionJobQueue).m_jobs.c.
           super__Deque_base<r_exec::_ReductionJob_*,_std::allocator<r_exec::_ReductionJob_*>_>.
           _M_impl.super__Deque_impl_data._M_finish + 0x18) = (_Map_pointer)0x0;
  std::_Deque_base<r_exec::_ReductionJob_*,_std::allocator<r_exec::_ReductionJob_*>_>::
  _M_initialize_map((_Deque_base<r_exec::_ReductionJob_*,_std::allocator<r_exec::_ReductionJob_*>_>
                     *)&(this->m_reductionJobQueue).m_jobs,0);
  (this->m_reductionJobQueue).m_pushMutex.super___mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)0x0;
  *(undefined1 (*) [16])
   ((long)&(this->m_reductionJobQueue).m_pushMutex.super___mutex_base._M_mutex + 0x10) =
       (undefined1  [16])0x0;
  *(undefined1 (*) [16])&(this->m_reductionJobQueue).m_pushMutex.super___mutex_base._M_mutex =
       (undefined1  [16])0x0;
  std::condition_variable::condition_variable(&(this->m_reductionJobQueue).m_canPushCondition);
  (this->m_reductionJobQueue).m_popMutex.super___mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)0x0;
  *(undefined1 (*) [16])
   ((long)&(this->m_reductionJobQueue).m_popMutex.super___mutex_base._M_mutex + 0x10) =
       (undefined1  [16])0x0;
  *(undefined1 (*) [16])&(this->m_reductionJobQueue).m_popMutex.super___mutex_base._M_mutex =
       (undefined1  [16])0x0;
  std::condition_variable::condition_variable(&(this->m_reductionJobQueue).m_canPopCondition);
  *(_Map_pointer *)
   ((long)&(this->m_timeJobQueue).m_jobs.c.
           super__Deque_base<r_exec::TimeJob_*,_std::allocator<r_exec::TimeJob_*>_>._M_impl.
           super__Deque_impl_data._M_finish + 0x18) = (_Map_pointer)0x0;
  *(undefined1 (*) [16])
   ((long)&(this->m_timeJobQueue).m_jobs.c.
           super__Deque_base<r_exec::TimeJob_*,_std::allocator<r_exec::TimeJob_*>_>._M_impl.
           super__Deque_impl_data._M_finish + 8) = (undefined1  [16])0x0;
  *(undefined1 (*) [16])
   ((long)&(this->m_timeJobQueue).m_jobs.c.
           super__Deque_base<r_exec::TimeJob_*,_std::allocator<r_exec::TimeJob_*>_>._M_impl.
           super__Deque_impl_data._M_start + 0x18) = (undefined1  [16])0x0;
  *(undefined1 (*) [16])
   ((long)&(this->m_timeJobQueue).m_jobs.c.
           super__Deque_base<r_exec::TimeJob_*,_std::allocator<r_exec::TimeJob_*>_>._M_impl.
           super__Deque_impl_data._M_start + 8) = (undefined1  [16])0x0;
  pdVar2 = &(this->m_timeJobQueue).m_jobs.c;
  (pdVar2->super__Deque_base<r_exec::TimeJob_*,_std::allocator<r_exec::TimeJob_*>_>)._M_impl.
  super__Deque_impl_data._M_map_size = 0;
  (pdVar2->super__Deque_base<r_exec::TimeJob_*,_std::allocator<r_exec::TimeJob_*>_>)._M_impl.
  super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  *(undefined1 (*) [16])
   &(this->m_timeJobQueue).m_mutex.super___mutex_base._M_mutex.__data.__list.__next =
       (undefined1  [16])0x0;
  *(undefined1 (*) [16])((long)&(this->m_timeJobQueue).m_mutex.super___mutex_base._M_mutex + 0x10) =
       (undefined1  [16])0x0;
  *(undefined1 (*) [16])&(this->m_timeJobQueue).m_mutex.super___mutex_base._M_mutex =
       (undefined1  [16])0x0;
  std::_Deque_base<r_exec::TimeJob_*,_std::allocator<r_exec::TimeJob_*>_>::_M_initialize_map
            ((_Deque_base<r_exec::TimeJob_*,_std::allocator<r_exec::TimeJob_*>_> *)
             &(this->m_timeJobQueue).m_jobs,0);
  *(undefined1 (*) [16])
   ((long)&(this->m_timeJobQueue).m_pushMutex.super___mutex_base._M_mutex + 0x10) =
       (undefined1  [16])0x0;
  *(undefined1 (*) [16])&(this->m_timeJobQueue).m_pushMutex.super___mutex_base._M_mutex =
       (undefined1  [16])0x0;
  (this->m_timeJobQueue).m_pushMutex.super___mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)0x0;
  std::condition_variable::condition_variable(&(this->m_timeJobQueue).m_canPushCondition);
  (this->m_timeJobQueue).m_popMutex.super___mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)0x0;
  *(undefined1 (*) [16])
   ((long)&(this->m_timeJobQueue).m_popMutex.super___mutex_base._M_mutex + 0x10) =
       (undefined1  [16])0x0;
  *(undefined1 (*) [16])&(this->m_timeJobQueue).m_popMutex.super___mutex_base._M_mutex =
       (undefined1  [16])0x0;
  std::condition_variable::condition_variable(&(this->m_timeJobQueue).m_canPopCondition);
  (this->m_coreThreads).super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_coreThreads).super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_coreThreads).super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  *(__pthread_internal_list **)
   ((long)&(this->m_reductionJobMutex).super___mutex_base._M_mutex + 0x18) =
       (__pthread_internal_list *)0x0;
  *(__pthread_internal_list **)
   ((long)&(this->m_reductionJobMutex).super___mutex_base._M_mutex + 0x20) =
       (__pthread_internal_list *)0x0;
  *(undefined1 (*) [16])((long)&(this->m_reductionJobMutex).super___mutex_base._M_mutex + 8) =
       (undefined1  [16])0x0;
  *(undefined1 (*) [16])&(this->m_timeJobMutex).super___mutex_base._M_mutex.__data.__list.__next =
       (undefined1  [16])0x0;
  *(undefined1 (*) [16])((long)&(this->m_timeJobMutex).super___mutex_base._M_mutex + 0x10) =
       (undefined1  [16])0x0;
  *(undefined1 (*) [16])&(this->m_timeJobMutex).super___mutex_base._M_mutex = (undefined1  [16])0x0;
  std::condition_variable::condition_variable(&this->m_coresRunning);
  *(undefined8 *)
   ((long)&(this->m_coreCountMutex).super___mutex_base._M_mutex.__data.__list.__prev + 4) = 0;
  *(undefined8 *)
   ((long)&(this->m_coreCountMutex).super___mutex_base._M_mutex.__data.__list.__next + 4) = 0;
  *(undefined8 *)((long)&(this->m_coreCountMutex).super___mutex_base._M_mutex + 0x10) = 0;
  (this->m_coreCountMutex).super___mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  (this->m_coreCountMutex).super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->m_coreCountMutex).super___mutex_base._M_mutex + 8) = 0;
  (this->m_stateMutex).super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->m_stateMutex).super___mutex_base._M_mutex + 8) = 0;
  *(undefined8 *)((long)&(this->m_stateMutex).super___mutex_base._M_mutex + 0x10) = 0;
  (this->m_stateMutex).super___mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  (this->m_stateMutex).super___mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)0x0;
  (this->objects).cells.
  super__Vector_base<r_code::list<core::P<r_code::Code>_>::cell,_std::allocator<r_code::list<core::P<r_code::Code>_>::cell>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->objects).cells.
  super__Vector_base<r_code::list<core::P<r_code::Code>_>::cell,_std::allocator<r_code::list<core::P<r_code::Code>_>::cell>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->objects).cells.
  super__Vector_base<r_code::list<core::P<r_code::Code>_>::cell,_std::allocator<r_code::list<core::P<r_code::Code>_>::cell>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  *(undefined4 *)&(this->objects).used_cells_head = 0xffffffff;
  *(undefined4 *)((long)&(this->objects).used_cells_head + 4) = 0xffffffff;
  *(undefined4 *)&(this->objects).used_cells_tail = 0xffffffff;
  *(undefined4 *)((long)&(this->objects).used_cells_tail + 4) = 0xffffffff;
  (this->objects).free_cells = -1;
  this->metadata = (Metadata *)0x0;
  (this->objects).used_cell_count = 0;
  (this->objects).free_cell_count = 0;
  (this->_root).object = (_Object *)0x0;
  (this->initial_groups).super__Vector_base<r_exec::Group_*,_std::allocator<r_exec::Group_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->initial_groups).super__Vector_base<r_exec::Group_*,_std::allocator<r_exec::Group_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  *(undefined8 *)
   ((long)&(this->initial_groups).
           super__Vector_base<r_exec::Group_*,_std::allocator<r_exec::Group_*>_>._M_impl.
           super__Vector_impl_data._M_finish + 1) = 0;
  *(undefined8 *)
   ((long)&(this->initial_groups).
           super__Vector_base<r_exec::Group_*,_std::allocator<r_exec::Group_*>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage + 1) = 0;
  this_00 = (ModelBase *)operator_new(0xa0);
  ModelBase::ModelBase(this_00);
  std::
  vector<r_code::list<core::P<r_code::Code>_>::cell,_std::allocator<r_code::list<core::P<r_code::Code>_>::cell>_>
  ::reserve(&(this->objects).cells,0x400);
  return;
}

Assistant:

_Mem::_Mem(): r_code::Mem(), state(NOT_STARTED), deleted(false)
{
    new ModelBase();
    objects.reserve(1024);
}